

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unaryWithOutputByComponent<double,_double,_int>::call
          (unaryWithOutputByComponent<double,_double,_int> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  code *pcVar1;
  uint uVar2;
  GLuint GVar3;
  _variable_type _Var4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  GLuint component;
  ulong uVar9;
  undefined8 uVar10;
  
  GVar3 = GPUShaderFP64Test10::functionObject::getResultStride((functionObject *)this,0);
  _Var4 = (*(this->super_unaryBase).super_functionObject._vptr_functionObject[4])(this,0);
  uVar5 = Utils::getNumberOfComponentsForVariableType(_Var4);
  _Var4 = (*(this->super_unaryBase).super_functionObject._vptr_functionObject[6])(this,1);
  uVar6 = Utils::getNumberOfComponentsForVariableType(_Var4);
  uVar2 = uVar6;
  if (uVar6 < uVar5) {
    uVar2 = uVar5;
  }
  pcVar1 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  uVar9 = 0;
  do {
    uVar7 = uVar9;
    if (uVar5 == 1) {
      uVar7 = 0;
    }
    uVar8 = uVar9;
    if (uVar6 == 1) {
      uVar8 = 0;
    }
    uVar10 = (*pcVar1)(*(undefined8 *)((long)argument_src + uVar7 * 8),
                       (long)result_dst + uVar8 * 4 + (ulong)GVar3);
    *(undefined8 *)((long)result_dst + uVar9 * 8) = uVar10;
    uVar9 = uVar9 + 1;
  } while (uVar2 != uVar9);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT* p_result = (ResT*)result_dst;
		OutT* p_out	= (OutT*)((glw::GLubyte*)result_dst + getResultOffset(1));
		ArgT* p_arg	= (ArgT*)argument_src;

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getResultComponents(1);
		const glw::GLuint n_components   = de::max(n_components_0, n_components_1);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const ArgT first_arg  = p_arg[component * component_step_0];
			OutT&	  second_arg = p_out[component * component_step_1];

			p_result[component] = p_function(first_arg, second_arg);
		}
	}